

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O3

vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
* __thiscall
ED::getSortedSegments
          (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           *__return_storage_ptr__,ED *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
  __i;
  pointer pvVar5;
  
  pvVar1 = (this->segmentPoints).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->segmentPoints).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar1 != pvVar2) {
    uVar4 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>*,std::vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ED::getSortedSegments()::__0>>
              (pvVar1,pvVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pvVar2 - (long)pvVar1 < 0x181) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>*,std::vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<ED::getSortedSegments()::__0>>
                (pvVar1,pvVar2);
    }
    else {
      pvVar5 = pvVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>*,std::vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<ED::getSortedSegments()::__0>>
                (pvVar1,pvVar5);
      for (; pvVar5 != pvVar2; pvVar5 = pvVar5 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>*,std::vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>,__gnu_cxx::__ops::_Val_comp_iter<ED::getSortedSegments()::__0>>
                  (pvVar5);
      }
    }
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector(__return_storage_ptr__,&this->segmentPoints);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Point>> ED::getSortedSegments()
{
		// sort segments from largest to smallest
		std::sort(segmentPoints.begin(), segmentPoints.end(), [](const std::vector<Point> & a, const std::vector<Point> & b) { return a.size() > b.size(); });

		return segmentPoints;
}